

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::LoadUncachedHeapArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  RegSlot R0;
  FncFlags FVar1;
  Symbol *this_00;
  ParseNodeFnc *pnodeFnc;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionBody *this_01;
  PropertyIdArray *propIds;
  uint count;
  
  if ((funcInfo->field_0xb4 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x21e,"(funcInfo->GetHasHeapArguments())","funcInfo->GetHasHeapArguments()")
    ;
    if (!bVar3) goto LAB_007566ac;
    *puVar4 = 0;
  }
  if (funcInfo->bodyScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x221,"(scope)","scope");
    if (!bVar3) goto LAB_007566ac;
    *puVar4 = 0;
  }
  this_00 = funcInfo->argumentsSymbol;
  if (this_00 == (Symbol *)0x0) {
LAB_00756543:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x223,"(argSym && argSym->IsArguments())","argSym && argSym->IsArguments()")
    ;
    if (!bVar3) goto LAB_007566ac;
    *puVar4 = 0;
  }
  else {
    bVar3 = Symbol::IsArguments(this_00);
    if (!bVar3) goto LAB_00756543;
  }
  R0 = this_00->location;
  pnodeFnc = funcInfo->root;
  FVar1 = pnodeFnc->fncFlags;
  count = (uint)funcInfo->inArgsCount - (uint)(pnodeFnc->pnodeRest == (ParseNodePtr)0x0);
  if (count == 0) {
    if (pnodeFnc->pnodeRest != (ParseNodePtr)0x0 || pnodeFnc->pnodeParams != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x22e,"(funcInfo->root->pnodeParams == nullptr && !hasRest)",
                         "funcInfo->root->pnodeParams == nullptr && !hasRest");
      if (!bVar3) {
LAB_007566ac:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    bVar3 = NeedScopeObjectForArguments(this,funcInfo,pnodeFnc);
    if ((bVar3) && (funcInfo->frameObjRegister != 0xffffffff)) {
      this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
      if (0x3fffffff < count) {
        Math::DefaultOverflowPolicy();
      }
      propIds = Js::FunctionBody::AllocatePropertyIdArrayForFormals(this_01,count * 4,count,'\0');
      GetFormalArgsArray(this,funcInfo,propIds);
    }
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,((short)FVar1 < 0) + LdHeapArguments,R0);
  EmitLocalPropInit(this,this_00->location,this_00,funcInfo);
  return;
}

Assistant:

void ByteCodeGenerator::LoadUncachedHeapArguments(FuncInfo *funcInfo)
{
    Assert(funcInfo->GetHasHeapArguments());

    Scope *scope = funcInfo->GetBodyScope();
    Assert(scope);
    Symbol *argSym = funcInfo->GetArgumentsSymbol();
    Assert(argSym && argSym->IsArguments());
    Js::RegSlot argumentsLoc = argSym->GetLocation();


    Js::OpCode opcode = !funcInfo->root->HasNonSimpleParameterList() ? Js::OpCode::LdHeapArguments : Js::OpCode::LdLetHeapArguments;
    bool hasRest = funcInfo->root->pnodeRest != nullptr;
    uint count = funcInfo->inArgsCount + (hasRest ? 1 : 0) - 1;
    if (count == 0)
    {
        // If no formals to function (only "this"), then no need to create the scope object.
        // Leave both the arguments location and the propertyIds location as null.
        Assert(funcInfo->root->pnodeParams == nullptr && !hasRest);
    }
    else if (!NeedScopeObjectForArguments(funcInfo, funcInfo->root))
    {
        // We may not need a scope object for arguments, e.g. strict mode with no eval.
    }
    else if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
    {
        // Pass the frame object and ID array to the runtime, and put the resulting Arguments object
        // at the expected location.
        Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(UInt32Math::Mul(count, sizeof(Js::PropertyId)), count, 0);
        GetFormalArgsArray(this, funcInfo, propIds);
    }

    this->m_writer.Reg1(opcode, argumentsLoc);
    EmitLocalPropInit(argSym->GetLocation(), argSym, funcInfo);
}